

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_bufhdr(ASMState *as,IRIns *ir)

{
  IRRef1 IVar1;
  Reg RVar2;
  bool bVar3;
  IRIns *local_30;
  IRIns *irp;
  IRIns irbp;
  Reg tmp;
  Reg sb;
  IRIns *ir_local;
  ASMState *as_local;
  
  _tmp = ir;
  ir_local = (IRIns *)as;
  irbp.gcr.gcptr64._4_4_ = ra_dest(as,ir,0xbfef);
  IVar1 = (_tmp->field_0).op2;
  if (IVar1 == 0) {
    irbp.field_1.op12 =
         ra_scratch((ASMState *)&ir_local->field_0,
                    (1 << ((byte)irbp.gcr.gcptr64._4_4_ & 0x1f) ^ 0xffffffffU) & 0xbfef);
    irp._4_2_ = 9;
    emit_storeofs((ASMState *)&ir_local->field_0,(IRIns *)&irp,irbp.field_1.op12,
                  irbp.gcr.gcptr64._4_4_,0);
    emit_loadofs((ASMState *)&ir_local->field_0,(IRIns *)&irp,irbp.field_1.op12,
                 irbp.gcr.gcptr64._4_4_,0x10);
  }
  else if (IVar1 == 1) {
    local_30 = (IRIns *)((long)ir_local[0x12] + (ulong)(_tmp->field_0).op1 * 8);
    if (((((local_30->field_1).r & 0x80) != 0) && (local_30 != _tmp + -1)) &&
       ((local_30 != _tmp + -2 ||
        ((((ulong)*_tmp & 0x80000000000000) == 0 || (*(char *)((long)_tmp + -1) != '\0')))))) {
      while( true ) {
        bVar3 = false;
        if ((local_30->field_1).o == 'U') {
          bVar3 = (local_30->field_0).op2 == 0;
        }
        if (bVar3) break;
        local_30 = (IRIns *)((long)ir_local[0x12] + (ulong)(local_30->field_0).op1 * 8);
      }
      if ((local_30->field_0).op1 < 0x8000) {
        RVar2 = ra_allocref((ASMState *)&ir_local->field_0,(uint)(_tmp->field_0).op1,0xbfef);
        ir_local[0x16].field_1.op12 = 1 << ((byte)RVar2 & 0x1f) | ir_local[0x16].field_1.op12;
        _tmp = local_30;
      }
    }
  }
  else if (IVar1 == 2) {
    asm_bufhdr_write((ASMState *)&ir_local->field_0,irbp.gcr.gcptr64._4_4_);
  }
  ra_left((ASMState *)&ir_local->field_0,irbp.gcr.gcptr64._4_4_,(uint)(_tmp->field_0).op1);
  return;
}

Assistant:

static void asm_bufhdr(ASMState *as, IRIns *ir)
{
  Reg sb = ra_dest(as, ir, RSET_GPR);
  switch (ir->op2) {
  case IRBUFHDR_RESET: {
    Reg tmp = ra_scratch(as, rset_exclude(RSET_GPR, sb));
    IRIns irbp;
    irbp.ot = IRT(0, IRT_PTR);  /* Buffer data pointer type. */
    emit_storeofs(as, &irbp, tmp, sb, offsetof(SBuf, w));
    emit_loadofs(as, &irbp, tmp, sb, offsetof(SBuf, b));
    break;
    }
  case IRBUFHDR_APPEND: {
    /* Rematerialize const buffer pointer instead of likely spill. */
    IRIns *irp = IR(ir->op1);
    if (!(ra_hasreg(irp->r) || irp == ir-1 ||
	  (irp == ir-2 && !ra_used(ir-1)))) {
      while (!(irp->o == IR_BUFHDR && irp->op2 == IRBUFHDR_RESET))
	irp = IR(irp->op1);
      if (irref_isk(irp->op1)) {
	ra_weak(as, ra_allocref(as, ir->op1, RSET_GPR));
	ir = irp;
      }
    }
    break;
    }
#if LJ_HASBUFFER
  case IRBUFHDR_WRITE:
    asm_bufhdr_write(as, sb);
    break;
#endif
  default: lj_assertA(0, "bad BUFHDR op2 %d", ir->op2); break;
  }
#if LJ_TARGET_X86ORX64
  ra_left(as, sb, ir->op1);
#else
  ra_leftov(as, sb, ir->op1);
#endif
}